

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::xpath_node_set::_assign
          (xpath_node_set *this,const_iterator begin_,const_iterator end_,type_t type_)

{
  xpath_node *__dest;
  undefined8 *puVar1;
  size_t __n;
  
  if (end_ < begin_) {
    __assert_fail("begin_ <= end_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x2f68,
                  "void pugi::xpath_node_set::_assign(const_iterator, const_iterator, type_t)");
  }
  __n = (long)end_ - (long)begin_;
  if ((ulong)((long)__n >> 4) < 2) {
    __dest = this->_storage;
  }
  else {
    __dest = (xpath_node *)
             (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                       allocate)(__n);
    if (__dest == (xpath_node *)0x0) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = clock_gettime;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  if (this->_begin != this->_storage) {
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              ();
  }
  if (end_ != begin_) {
    memcpy(__dest,begin_,__n);
  }
  this->_begin = __dest;
  this->_end = __dest + ((long)__n >> 4);
  this->_type = type_;
  return;
}

Assistant:

PUGI__FN void xpath_node_set::_assign(const_iterator begin_, const_iterator end_, type_t type_)
	{
		assert(begin_ <= end_);

		size_t size_ = static_cast<size_t>(end_ - begin_);

		// use internal buffer for 0 or 1 elements, heap buffer otherwise
		xpath_node* storage = (size_ <= 1) ? _storage : static_cast<xpath_node*>(impl::xml_memory::allocate(size_ * sizeof(xpath_node)));

		if (!storage)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return;
		#else
			throw std::bad_alloc();
		#endif
		}

		// deallocate old buffer
		if (_begin != _storage)
			impl::xml_memory::deallocate(_begin);

		// size check is necessary because for begin_ = end_ = nullptr, memcpy is UB
		if (size_)
			memcpy(storage, begin_, size_ * sizeof(xpath_node));

		_begin = storage;
		_end = storage + size_;
		_type = type_;
	}